

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start,int output)

{
  int iVar1;
  lys_module *plVar2;
  bool bVar3;
  lys_module *local_c8;
  lys_module *local_b0;
  lys_module *prev_mod;
  lys_module *module;
  lys_module *prefix_mod;
  int local_90;
  int backup_mod_name_len;
  int yang_data_name_len;
  int has_predicate;
  int is_relative;
  int mod_name_len;
  int nam_len;
  int r;
  lys_node *parent;
  lys_node *start_parent;
  lys_node *sibling;
  char *yang_data_name;
  char *backup_mod_name;
  char *id;
  char *mod_name;
  char *name;
  char *str;
  lys_node *plStack_28;
  int output_local;
  lys_node *start_local;
  ly_ctx *ctx_local;
  char *nodeid_local;
  
  yang_data_name = (char *)0x0;
  sibling = (lys_node *)0x0;
  yang_data_name_len = -1;
  str._4_4_ = output;
  plStack_28 = start;
  start_local = (lys_node *)ctx;
  ctx_local = (ly_ctx *)nodeid;
  if ((nodeid == (char *)0x0) || ((ctx == (ly_ctx *)0x0 && (start == (lys_node *)0x0)))) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x931,
                  "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    start_local = (lys_node *)start->module->ctx;
  }
  backup_mod_name = nodeid;
  mod_name_len = parse_schema_nodeid(nodeid,&id,&has_predicate,&mod_name,&is_relative,
                                     &yang_data_name_len,(int *)0x0,(int *)0x0,1);
  if (mod_name_len < 1) {
    ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len);
  }
  else {
    if (*mod_name == '#') {
      if (yang_data_name_len != 0) {
        ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,0x23,mod_name);
        return (lys_node *)0x0;
      }
      sibling = (lys_node *)(mod_name + 1);
      local_90 = is_relative + -1;
      yang_data_name = id;
      prefix_mod._4_4_ = has_predicate;
      backup_mod_name = backup_mod_name + mod_name_len;
    }
    else {
      yang_data_name_len = -1;
    }
    mod_name_len = parse_schema_nodeid(backup_mod_name,&id,&has_predicate,&mod_name,&is_relative,
                                       &yang_data_name_len,&backup_mod_name_len,(int *)0x0,0);
    if (mod_name_len < 1) {
      ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
              (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len);
    }
    else {
      backup_mod_name = backup_mod_name + mod_name_len;
      if (yang_data_name != (char *)0x0) {
        id = yang_data_name;
        has_predicate = prefix_mod._4_4_;
      }
      if (yang_data_name_len != 0) {
        if (plStack_28 == (lys_node *)0x0) {
          __assert_fail("start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x957,
                        "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                       );
        }
        parent = plStack_28;
        while( true ) {
          bVar3 = false;
          if (parent != (lys_node *)0x0) {
            bVar3 = parent->nodetype == LYS_USES;
          }
          if (!bVar3) break;
          parent = lys_parent(parent);
        }
        prev_mod = plStack_28->module;
LAB_0011827d:
        local_b0 = prev_mod;
        do {
          start_parent = (lys_node *)0x0;
          do {
            do {
              do {
                start_parent = lys_getnext(start_parent,parent,prev_mod,0);
                if (start_parent == (lys_node *)0x0) goto LAB_001185f1;
              } while (((start_parent->name == (char *)0x0) ||
                       (iVar1 = strncmp(mod_name,start_parent->name,(long)is_relative), iVar1 != 0))
                      || (start_parent->name[is_relative] != '\0'));
              _nam_len = lys_parent(start_parent);
              while( true ) {
                bVar3 = false;
                if (_nam_len != (lys_node *)0x0) {
                  bVar3 = (_nam_len->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN;
                }
                if (!bVar3) break;
                _nam_len = lys_parent(_nam_len);
              }
            } while ((_nam_len != (lys_node *)0x0) &&
                    (((str._4_4_ != 0 && (_nam_len->nodetype == LYS_INPUT)) ||
                     ((str._4_4_ == 0 && (_nam_len->nodetype == LYS_OUTPUT))))));
            if (id == (char *)0x0) {
              module = local_b0;
            }
            else {
              module = ly_ctx_nget_module((ly_ctx *)start_local,id,(long)has_predicate,(char *)0x0,1
                                         );
              if (module == (lys_module *)0x0) {
                name = strndup((char *)ctx_local,
                               (size_t)(id + ((long)has_predicate - (long)ctx_local)));
                ly_vlog((ly_ctx *)start_local,LYE_PATH_INMOD,LY_VLOG_STR,name);
                free(name);
                return (lys_node *)0x0;
              }
            }
            plVar2 = lys_node_module(start_parent);
          } while (module != plVar2);
          if (backup_mod_name_len != 0) {
            mod_name_len = 0;
            if ((start_parent->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              if (start_parent->nodetype != LYS_LIST) {
                ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                        (ulong)(uint)(int)*backup_mod_name,backup_mod_name);
                return (lys_node *)0x0;
              }
              iVar1 = resolve_json_schema_list_predicate
                                (backup_mod_name,(lys_node_list *)start_parent,&mod_name_len);
              if (iVar1 != 0) {
                return (lys_node *)0x0;
              }
            }
            else {
              mod_name_len = parse_schema_json_predicate
                                       (backup_mod_name,(char **)0x0,(int *)0x0,(char **)0x0,
                                        (int *)0x0,(char **)0x0,(int *)0x0,&backup_mod_name_len);
              if (mod_name_len < 1) {
                ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                        (ulong)(uint)(int)backup_mod_name[-mod_name_len],
                        backup_mod_name + -mod_name_len);
                return (lys_node *)0x0;
              }
            }
            backup_mod_name = backup_mod_name + mod_name_len;
          }
          if (*backup_mod_name == '\0') {
            return start_parent;
          }
          if ((start_parent->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                    (ulong)(uint)(int)*backup_mod_name,backup_mod_name);
            return (lys_node *)0x0;
          }
          parent = start_parent;
          if (start_parent->child == (lys_node *)0x0) {
            local_c8 = prev_mod;
          }
          else {
            local_c8 = lys_node_module(start_parent->child);
          }
          local_b0 = local_c8;
LAB_001185f1:
          if (start_parent == (lys_node *)0x0) {
            name = strndup((char *)ctx_local,
                           (size_t)(mod_name + ((long)is_relative - (long)ctx_local)));
            ly_vlog((ly_ctx *)start_local,LYE_PATH_INNODE,LY_VLOG_STR,name);
            free(name);
            return (lys_node *)0x0;
          }
          mod_name_len = parse_schema_nodeid(backup_mod_name,&id,&has_predicate,&mod_name,
                                             &is_relative,&yang_data_name_len,&backup_mod_name_len,
                                             (int *)0x0,0);
          if (mod_name_len < 1) {
            ly_vlog((ly_ctx *)start_local,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                    (ulong)(uint)(int)backup_mod_name[-mod_name_len],backup_mod_name + -mod_name_len
                   );
            return (lys_node *)0x0;
          }
          backup_mod_name = backup_mod_name + mod_name_len;
        } while( true );
      }
      if (id == (char *)0x0) {
        name = strndup((char *)ctx_local,(size_t)(mod_name + ((long)is_relative - (long)ctx_local)))
        ;
        ly_vlog((ly_ctx *)start_local,LYE_PATH_MISSMOD,LY_VLOG_STR,ctx_local);
        free(name);
      }
      else {
        name = strndup(id,(long)has_predicate);
        prev_mod = ly_ctx_get_module((ly_ctx *)start_local,name,(char *)0x0,1);
        free(name);
        if (prev_mod == (lys_module *)0x0) {
          name = strndup((char *)ctx_local,(size_t)(id + ((long)has_predicate - (long)ctx_local)));
          ly_vlog((ly_ctx *)start_local,LYE_PATH_INMOD,LY_VLOG_STR,name);
          free(name);
        }
        else {
          parent = (lys_node *)0x0;
          if ((sibling == (lys_node *)0x0) ||
             (parent = lyp_get_yang_data_template(prev_mod,(char *)sibling,local_90),
             parent != (lys_node *)0x0)) {
            id = (char *)0x0;
            has_predicate = 0;
            goto LAB_0011827d;
          }
          name = strndup((char *)ctx_local,(long)sibling + ((long)local_90 - (long)ctx_local));
          ly_vlog((ly_ctx *)start_local,LYE_PATH_INNODE,LY_VLOG_STR,name);
          free(name);
        }
      }
    }
  }
  return (lys_node *)0x0;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, const struct ly_ctx *ctx, const struct lys_node *start, int output)
{
    char *str;
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *start_parent, *parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate;
    int yang_data_name_len, backup_mod_name_len;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        }

        str = strndup(mod_name, mod_name_len);
        module = ly_ctx_get_module(ctx, str, NULL, 1);
        free(str);

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module, 0))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* output check */
                for (parent = lys_parent(sibling); parent && !(parent->nodetype & (LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
                if (parent) {
                    if (output && (parent->nodetype == LYS_INPUT)) {
                        continue;
                    } else if (!output && (parent->nodetype == LYS_OUTPUT)) {
                        continue;
                    }
                }

                /* module check */
                if (mod_name) {
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    return NULL;
                }
                start_parent = sibling;

                /* update prev mod */
                prev_mod = (start_parent->child ? lys_node_module(start_parent->child) : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return NULL;
}